

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O1

streamsize __thiscall avro::istreambuf::xsgetn(istreambuf *this,char_type *c,streamsize len)

{
  ulong uVar1;
  streamsize sVar2;
  ulong __n;
  
  if (len < 1) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      uVar1 = *(long *)&this->field_0x18 - (long)*(void **)&this->field_0x10;
      if (uVar1 != 0) {
        __n = len - sVar2;
        if (uVar1 <= (ulong)(len - sVar2)) {
          __n = uVar1;
        }
        memcpy(c,*(void **)&this->field_0x10,__n);
        c = c + __n;
        sVar2 = sVar2 + __n;
        *(long *)&this->field_0x10 = *(long *)&this->field_0x10 + (long)(int)__n;
      }
    } while ((sVar2 < len) &&
            ((**(code **)(*(long *)this + 0x48))(this),
            (this->iter_).helper_.iter_._M_cur !=
            (((this->buffer_).pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur));
  }
  return sVar2;
}

Assistant:

virtual std::streamsize xsgetn(char_type *c, std::streamsize len) 
    {
        std::streamsize bytesCopied = 0;

        while (bytesCopied < len) {

            size_t inBuffer = egptr() - gptr();

            if (inBuffer) {
                size_t remaining = static_cast<size_t>(len - bytesCopied);
                size_t toCopy = std::min(inBuffer, remaining);
                memcpy(c, gptr(), toCopy);
                c += toCopy;
                bytesCopied += toCopy;
                gbump(toCopy);
            }

            if(bytesCopied < len) {
                underflow();
                if(iter_ == buffer_.end()) {
                    break;
                }
            }
        }

        return bytesCopied;
    }